

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_SimpleArray<ON_MeshPart>::Append(ON_SimpleArray<ON_MeshPart> *this,ON_MeshPart *x)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  ON_MeshPart *pOVar4;
  ON_MeshPart *pOVar5;
  uint uVar6;
  
  uVar3 = this->m_count;
  pOVar4 = x;
  if (uVar3 == this->m_capacity) {
    if (((int)uVar3 < 8) || ((ulong)((long)(int)uVar3 * 0x18) < 0x10000001)) {
      uVar6 = 4;
      if (2 < (int)uVar3) {
        uVar6 = uVar3 * 2;
      }
    }
    else {
      uVar6 = 0xaaaab2;
      if (uVar3 < 0xaaaab2) {
        uVar6 = uVar3;
      }
      uVar6 = uVar6 + uVar3;
    }
    if (x < this->m_a + (int)uVar3 && this->m_a <= x) {
      pOVar4 = (ON_MeshPart *)onmalloc(0x18);
      iVar2 = x->triangle_count;
      pOVar4->vertex_count = x->vertex_count;
      pOVar4->triangle_count = iVar2;
      uVar1 = *(undefined8 *)x->fi;
      *(undefined8 *)pOVar4->vi = *(undefined8 *)x->vi;
      *(undefined8 *)pOVar4->fi = uVar1;
      uVar3 = this->m_capacity;
    }
    if (uVar3 < uVar6) {
      SetCapacity(this,(long)(int)uVar6);
    }
    pOVar5 = this->m_a;
    if (pOVar5 == (ON_MeshPart *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    uVar3 = this->m_count;
  }
  else {
    pOVar5 = this->m_a;
  }
  this->m_count = uVar3 + 1;
  iVar2 = pOVar4->triangle_count;
  pOVar5[(int)uVar3].vertex_count = pOVar4->vertex_count;
  pOVar5[(int)uVar3].triangle_count = iVar2;
  uVar1 = *(undefined8 *)pOVar4->fi;
  *(undefined8 *)pOVar5[(int)uVar3].vi = *(undefined8 *)pOVar4->vi;
  *(undefined8 *)pOVar5[(int)uVar3].fi = uVar1;
  if (pOVar4 != x) {
    onfree(pOVar4);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}